

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O3

uint __thiscall
llvm::DWARFVerifier::verifyNameIndexEntries(DWARFVerifier *this,NameIndex *NI,NameTableEntry *NTE)

{
  undefined1 *this_00;
  undefined8 *puVar1;
  undefined1 auVar2 [8];
  size_t sVar3;
  char cVar4;
  Tag TVar5;
  undefined2 uVar6;
  uint uVar7;
  raw_ostream *prVar8;
  ErrorInfoBase *pEVar9;
  StringRef *pSVar10;
  long lVar11;
  long *plVar12;
  undefined1 in_R8B;
  DWARFUnit *pDVar13;
  undefined8 *puVar14;
  bool bVar15;
  StringRef Fmt;
  StringRef Fmt_00;
  StringRef Fmt_01;
  StringRef Fmt_02;
  StringRef Fmt_03;
  StringRef Fmt_04;
  Optional<unsigned_long> OVar16;
  undefined1 local_2c8 [8];
  Expected<llvm::DWARFDebugNames::Entry> EntryOr;
  NameTableEntry **local_200;
  void *local_1f8;
  NameTableEntry *local_1f0;
  _func_int **local_1e8;
  StringRef *local_1e0;
  long local_1d0;
  byte local_150;
  _func_int **local_148;
  StringRef *local_140;
  NameTableEntry *local_138;
  _func_int **local_130;
  DWARFDebugInfoEntry **local_128;
  undefined1 local_120 [8];
  StringRef Str;
  SmallVector<llvm::StringRef,_2U> EntryNames;
  uint64_t NextEntryID;
  tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  local_d0;
  int local_74;
  Error EStack_70;
  uint NumEntries;
  uint64_t CUOffset;
  DWARFDie DIE;
  uint64_t EntryID;
  uint32_t CUIndex;
  uint64_t DIEOffset;
  uint local_34;
  uint NumErrors;
  
  if ((NI->Hdr).super_HeaderPOD.LocalTypeUnitCount + (NI->Hdr).super_HeaderPOD.ForeignTypeUnitCount
      != 0) {
    return 0;
  }
  local_2c8 = (undefined1  [8])NTE->StringOffset;
  local_120 = (undefined1  [8])DataExtractor::getCStr(&NTE->StrData,(uint64_t *)local_2c8);
  if (local_120 == (undefined1  [8])0x0) {
    prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,(StringRef)ZEXT816(0),
                              (bool)in_R8B);
    local_1f0 = (NameTableEntry *)NI->Base;
    EntryOr._184_8_ = &PTR_anchor_010789b0;
    Fmt.Length = 0x43;
    Fmt.Data = "Name Index @ {0:x}: Unable to get string associated with name {1}.\n";
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
    ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>_>
                      *)local_2c8,Fmt,
                     (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_int>_>
                      *)&EntryOr.field_0xb8);
    raw_ostream::operator<<(prVar8,(formatv_object_base *)local_2c8);
    if (EntryOr.field_0._32_8_ != 0) {
      operator_delete((void *)EntryOr.field_0._32_8_,EntryOr.field_0._48_8_ - EntryOr.field_0._32_8_
                     );
    }
    if (EntryOr.field_0._8_8_ != 0) {
      operator_delete((void *)EntryOr.field_0._8_8_,EntryOr.field_0._24_8_ - EntryOr.field_0._8_8_);
    }
    return 1;
  }
  Str.Data = (char *)strlen((char *)local_120);
  local_34 = 0;
  local_74 = 0;
  EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_ =
       NTE->EntryOffset;
  local_138 = NTE;
  DIE.Die = (DWARFDebugInfoEntry *)
            EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_;
  DWARFDebugNames::NameIndex::getEntry
            ((Expected<llvm::DWARFDebugNames::Entry> *)local_2c8,NI,
             (uint64_t *)
             (EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer + 8));
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    local_148 = (_func_int **)&PTR_anchor_01078bf8;
    DIEOffset = (uint64_t)&PTR_anchor_01078920;
    local_130 = (_func_int **)&PTR_anchor_01078d18;
    local_128 = (DWARFDebugInfoEntry **)&PTR_anchor_01078d48;
    local_140 = (StringRef *)&PTR_anchor_01077d78;
    this_00 = &EntryOr.field_0xb8;
    do {
      OVar16 = DWARFDebugNames::Entry::getCUIndex((Entry *)local_2c8);
      if (((undefined1  [16])OVar16.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_00d83a9b:
        __assert_fail("hasVal",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/Optional.h"
                      ,0xad,
                      "T &llvm::optional_detail::OptionalStorage<unsigned long>::getValue() & [T = unsigned long]"
                     );
      }
      uVar7 = OVar16.Storage.field_0._0_4_;
      EntryID = CONCAT44(EntryID._4_4_,uVar7);
      if ((NI->Hdr).super_HeaderPOD.CompUnitCount < uVar7) {
        prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,
                                  (StringRef)ZEXT816(0),(bool)in_R8B);
        local_d0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)NI->Base;
        local_d0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
        ._M_head_impl.super_format_adapter._vptr_format_adapter = local_148;
        local_d0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
        ._M_head_impl.Item.begin_iterator = (StringRef *)&EntryID;
        local_d0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
        ._M_head_impl.Item.end_iterator = (StringRef *)&PTR_anchor_01078ba8;
        local_d0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
        _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&DIE.Die;
        local_d0.
        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .
        super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
        .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
        _M_head_impl.Item = (StringRef *)DIEOffset;
        Fmt_00.Length = 0x46;
        Fmt_00.Data = "Name Index @ {0:x}: Entry @ {1:x} contains an invalid CU index ({2}).\n";
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
        ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>_>
                          *)this_00,Fmt_00,
                         (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_int_&>_>
                          *)&local_d0);
        raw_ostream::operator<<(prVar8,(formatv_object_base *)this_00);
LAB_00d83548:
        if (local_1e0 != (StringRef *)0x0) {
          operator_delete(local_1e0,local_1d0 - (long)local_1e0);
        }
        if (local_1f8 != (void *)0x0) {
          operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
        }
        local_34 = local_34 + 1;
      }
      else {
        pEVar9 = (ErrorInfoBase *)DWARFDebugNames::NameIndex::getCUOffset(NI,uVar7);
        EStack_70.Payload = pEVar9;
        if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) goto LAB_00d83aba;
        OVar16 = DWARFDebugNames::Entry::getDIEUnitOffset((Entry *)local_2c8);
        if (((undefined1  [16])OVar16.Storage & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_00d83a9b;
        _CUIndex = (_func_int *)((long)&pEVar9->_vptr_ErrorInfoBase + OVar16.Storage.field_0.value);
        _CUOffset = DWARFContext::getDIEForOffset(this->DCtx,(uint64_t)_CUIndex);
        if (CUOffset == (DWARFUnit *)0x0 || DIE.U == (DWARFUnit *)0x0) {
          prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)NI->Base;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.super_format_adapter._vptr_format_adapter =
               (_func_int **)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.begin_iterator = (StringRef *)&CUIndex;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.end_iterator = (StringRef *)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&DIE.Die;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.Item = (StringRef *)DIEOffset;
          Fmt_01.Length = 0x49;
          Fmt_01.Data = "Name Index @ {0:x}: Entry @ {1:x} references a non-existing DIE @ {2:x}.\n"
          ;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>_>
                            *)this_00,Fmt_01,
                           (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>_>
                            *)&local_d0);
          raw_ostream::operator<<(prVar8,(formatv_object_base *)this_00);
          goto LAB_00d83548;
        }
        if ((ErrorInfoBase *)(CUOffset->Header).Offset == EStack_70.Payload) {
          bVar15 = true;
        }
        else {
          prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)NI->Base;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.begin_iterator = *(StringRef **)(CUOffset + 0x18);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)DIEOffset;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.end_iterator = (StringRef *)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter =
               (_func_int **)&stack0xffffffffffffff90;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.Item = (StringRef *)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&CUIndex;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.Item = (unsigned_long *)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&DIE.Die;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.Item = (unsigned_long *)DIEOffset;
          Fmt_02.Length = 100;
          Fmt_02.Data = 
          "Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n"
          ;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>_>
                            *)this_00,Fmt_02,
                           (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long>_>
                            *)&local_d0);
          raw_ostream::operator<<(prVar8,(formatv_object_base *)this_00);
          if (local_1e0 != (StringRef *)0x0) {
            operator_delete(local_1e0,local_1d0 - (long)local_1e0);
          }
          if (local_1f8 != (void *)0x0) {
            operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
          }
          local_34 = local_34 + 1;
          bVar15 = CUOffset != 0;
        }
        if ((!bVar15) || (DIE.U == (DWARFUnit *)0x0)) {
LAB_00d83ad9:
          __assert_fail("isValid() && \"must check validity prior to calling\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/DebugInfo/DWARF/DWARFDie.h"
                        ,0x3b,
                        "const DWARFAbbreviationDeclaration *llvm::DWARFDie::getAbbreviationDeclarationPtr() const"
                       );
        }
        if ((DWARFAbbreviationDeclaration *)(DIE.U)->InfoSection ==
            (DWARFAbbreviationDeclaration *)0x0) {
          TVar5 = DW_TAG_null;
        }
        else {
          TVar5 = ((DWARFAbbreviationDeclaration *)(DIE.U)->InfoSection)->Tag;
        }
        if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) {
LAB_00d83aba:
          __assert_fail("!HasError && \"Cannot get value when an error exists!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/Error.h"
                        ,0x272,
                        "storage_type *llvm::Expected<llvm::DWARFDebugNames::Entry>::getStorage() [T = llvm::DWARFDebugNames::Entry]"
                       );
        }
        if (TVar5 != *(Tag *)(EntryOr.field_0._168_8_ + 4)) {
          prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) != 0) goto LAB_00d83aba;
          if ((CUOffset == 0) || (DIE.U == (DWARFUnit *)0x0)) goto LAB_00d83ad9;
          if ((DIE.U)->InfoSection == (DWARFSection *)0x0) {
            uVar6 = 0;
          }
          else {
            uVar6 = *(undefined2 *)((long)&((DIE.U)->InfoSection->Data).Data + 4);
          }
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)NI->Base;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)local_140;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.begin_iterator =
               (StringRef *)
               CONCAT62(local_d0.
                        super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
                        .
                        super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
                        .
                        super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
                        .
                        super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
                        .
                        super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
                        .
                        super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
                        ._M_head_impl.Item.begin_iterator._2_6_,uVar6);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.end_iterator = local_140;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter._0_2_ =
               *(undefined2 *)(EntryOr.field_0._168_8_ + 4);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.Item = (StringRef *)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&CUIndex;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.Item = (unsigned_long *)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)&DIE.Die;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.Item = (unsigned_long *)DIEOffset;
          Fmt_03.Length = 0x61;
          Fmt_03.Data = 
          "Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
          ;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>_>
                            *)this_00,Fmt_03,
                           (tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>,_llvm::detail::provider_format_adapter<llvm::dwarf::Tag>_>
                            *)&local_d0);
          raw_ostream::operator<<(prVar8,(formatv_object_base *)this_00);
          if (local_1e0 != (StringRef *)0x0) {
            operator_delete(local_1e0,local_1d0 - (long)local_1e0);
          }
          if (local_1f8 != (void *)0x0) {
            operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
          }
          local_34 = local_34 + 1;
        }
        getNames((SmallVector<llvm::StringRef,_2U> *)&Str.Length,(DWARFDie *)&CUOffset,true);
        pSVar10 = std::
                  __find_if<llvm::StringRef*,__gnu_cxx::__ops::_Iter_equals_val<llvm::StringRef_const>>
                            (Str.Length,
                             (ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                                          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                          super_SmallVectorBase.BeginX * 0x10 + Str.Length,local_120
                            );
        if (pSVar10 ==
            (StringRef *)
            ((ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                          super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                          super_SmallVectorBase.BeginX * 0x10 + Str.Length)) {
          prVar8 = WithColor::error((WithColor *)this->OS,(raw_ostream *)0xe67796,
                                    (StringRef)ZEXT816(0),(bool)in_R8B);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
          _M_head_impl.Item = NI->Base;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.end_iterator =
               (StringRef *)
               ((ulong)(uint)EntryNames.super_SmallVectorImpl<llvm::StringRef>.
                             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                             super_SmallVectorBase.BeginX * 0x10 + Str.Length);
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.Item.begin_iterator = (StringRef *)Str.Length;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
          ._M_head_impl.super_format_adapter._vptr_format_adapter = local_130;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)local_128;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
          _M_head_impl.Item = (StringRef *)local_120;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter =
               (_func_int **)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.Item = (unsigned_long *)&CUIndex;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter =
               (_func_int **)&PTR_anchor_01078ba8;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .
          super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_false>.
          _M_head_impl.Item = (unsigned_long *)&DIE.Die;
          local_d0.
          super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
          .super__Head_base<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_false>.
          _M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)DIEOffset;
          Fmt_04.Length = 0x62;
          Fmt_04.Data = 
          "Name Index @ {0:x}: Entry @ {1:x}: mismatched Name of DIE @ {2:x}: index - {3}; debug_info - {4}.\n"
          ;
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
          ::formatv_object((formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>_>
                            *)this_00,Fmt_04,&local_d0);
          raw_ostream::operator<<(prVar8,(formatv_object_base *)this_00);
          if (local_1e0 != (StringRef *)0x0) {
            operator_delete(local_1e0,local_1d0 - (long)local_1e0);
          }
          if (local_1f8 != (void *)0x0) {
            operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
          }
          local_34 = local_34 + 1;
        }
        if ((uint *)Str.Length !=
            &EntryNames.super_SmallVectorImpl<llvm::StringRef>.
             super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
          free((void *)Str.Length);
        }
      }
      local_74 = local_74 + 1;
      DIE.Die = (DWARFDebugInfoEntry *)
                EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer._8_8_;
      DWARFDebugNames::NameIndex::getEntry
                ((Expected<llvm::DWARFDebugNames::Entry> *)this_00,NI,
                 (uint64_t *)
                 (EntryNames.super_SmallVectorStorage<llvm::StringRef,_2U>.InlineElts[1].buffer + 8)
                );
      if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
        local_2c8 = (undefined1  [8])&PTR___cxa_pure_virtual_01077f88;
        if (EntryOr.field_0.ErrorStorage.buffer !=
            (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
             )((long)&EntryOr.field_0 + 0x10)) {
          free((void *)EntryOr.field_0.ErrorStorage.buffer);
        }
      }
      else {
        if ((char  [8])local_2c8 != (char  [8])0x0) {
          (**(code **)(*(undefined **)local_2c8 + 8))();
        }
        local_2c8[0] = '\0';
        local_2c8[1] = '\0';
        local_2c8[2] = '\0';
        local_2c8[3] = '\0';
        local_2c8[4] = '\0';
        local_2c8[5] = '\0';
        local_2c8[6] = '\0';
        local_2c8[7] = '\0';
      }
      Expected<llvm::DWARFDebugNames::Entry>::moveConstruct<llvm::DWARFDebugNames::Entry>
                ((Expected<llvm::DWARFDebugNames::Entry> *)local_2c8,
                 (Expected<llvm::DWARFDebugNames::Entry> *)this_00);
      if ((local_150 & 1) == 0) {
        EntryOr._184_8_ = &PTR___cxa_pure_virtual_01077f88;
        if (local_200 != &local_1f0) {
          free(local_200);
        }
      }
      else if (EntryOr._184_8_ != 0) {
        (**(code **)(*(long *)EntryOr._184_8_ + 8))();
      }
    } while ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0);
  }
  auVar2 = local_2c8;
  local_2c8[0] = '\0';
  local_2c8[1] = '\0';
  local_2c8[2] = '\0';
  local_2c8[3] = '\0';
  local_2c8[4] = '\0';
  local_2c8[5] = '\0';
  local_2c8[6] = '\0';
  local_2c8[7] = '\0';
  EntryOr._184_8_ = &local_74;
  local_1f0 = local_138;
  local_1e8 = (_func_int **)local_120;
  local_1e0 = (StringRef *)&local_34;
  local_d0.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
  ._M_head_impl.Item.end_iterator = (StringRef *)local_138;
  plVar12 = (long *)((ulong)auVar2 & 0xfffffffffffffffe);
  local_d0.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
  ._M_head_impl.super_format_adapter._vptr_format_adapter = (_func_int **)this;
  local_d0.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Head_base<4UL,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>,_false>
  ._M_head_impl.Item.begin_iterator = (StringRef *)NI;
  local_d0.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
  _M_head_impl.super_format_adapter._vptr_format_adapter = local_1e8;
  local_d0.
  super__Tuple_impl<0UL,_llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<1UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<2UL,_llvm::detail::provider_format_adapter<unsigned_long_&>,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .
  super__Tuple_impl<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_llvm::detail::provider_format_adapter<llvm::iterator_range<llvm::StringRef_*>_>_>
  .super__Head_base<3UL,_llvm::detail::provider_format_adapter<llvm::StringRef_&>,_false>.
  _M_head_impl.Item = local_1e0;
  if (plVar12 == (long *)0x0) {
    EntryID = 1;
  }
  else {
    cVar4 = (**(code **)(*plVar12 + 0x30))(plVar12);
    if (cVar4 == '\0') {
      Str.Length = (size_t)plVar12;
      handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                 &EntryID,(anon_class_48_6_0fa2c5c1 *)&Str.Length,
                 (anon_class_40_5_28e94b40 *)&EntryOr.field_0xb8);
      if (Str.Length == 0) goto LAB_00d83a28;
      lVar11 = *(long *)Str.Length;
      plVar12 = (long *)Str.Length;
    }
    else {
      EntryID = 1;
      puVar14 = (undefined8 *)plVar12[1];
      puVar1 = (undefined8 *)plVar12[2];
      pDVar13 = (DWARFUnit *)EntryID;
      if (puVar14 != puVar1) {
        pDVar13 = (DWARFUnit *)0x1;
        DIEOffset = (uint64_t)plVar12;
        do {
          CUOffset = (uint64_t)pDVar13;
          _CUIndex = (_func_int *)*puVar14;
          *puVar14 = 0;
          handleErrorImpl<llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__0,llvm::DWARFVerifier::verifyNameIndexEntries(llvm::DWARFDebugNames::NameIndex_const&,llvm::DWARFDebugNames::NameTableEntry_const&)::__1>
                    ((unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)
                     &stack0xffffffffffffff90,(anon_class_48_6_0fa2c5c1 *)&CUIndex,
                     (anon_class_40_5_28e94b40 *)&EntryOr.field_0xb8);
          ErrorList::join((ErrorList *)&Str.Length,(Error *)&CUOffset,&stack0xffffffffffffff90);
          sVar3 = Str.Length;
          Str.Length = 0;
          if ((long *)((ulong)EStack_70.Payload & 0xfffffffffffffffe) != (long *)0x0) {
            (**(code **)(*(long *)((ulong)EStack_70.Payload & 0xfffffffffffffffe) + 8))();
          }
          if (_CUIndex != (_func_int *)0x0) {
            (**(code **)(*(long *)_CUIndex + 8))();
          }
          _CUIndex = (_func_int *)0x0;
          if (((undefined1  [16])_CUOffset & (undefined1  [16])0xfffffffffffffffe) !=
              (undefined1  [16])0x0) {
            (**(code **)(*(long *)(CUOffset & 0xfffffffffffffffe) + 8))();
          }
          pDVar13 = (DWARFUnit *)(sVar3 | 1);
          puVar14 = puVar14 + 1;
          plVar12 = (long *)DIEOffset;
        } while (puVar14 != puVar1);
      }
      EntryID = (uint64_t)pDVar13;
      lVar11 = *plVar12;
    }
    (**(code **)(lVar11 + 8))(plVar12);
  }
LAB_00d83a28:
  cantFail((Error *)&EntryID,(char *)0x0);
  if ((long *)(EntryID & 0xfffffffffffffffe) != (long *)0x0) {
    (**(code **)(*(long *)(EntryID & 0xfffffffffffffffe) + 8))();
  }
  uVar7 = local_34;
  if ((EntryOr.field_0.TStorage.buffer[0xb0] & 1U) == 0) {
    local_2c8 = (undefined1  [8])&PTR___cxa_pure_virtual_01077f88;
    if (EntryOr.field_0.ErrorStorage.buffer !=
        (AlignedCharArrayUnion<std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>_>
         )((long)&EntryOr.field_0 + 0x10)) {
      free((void *)EntryOr.field_0.ErrorStorage.buffer);
    }
  }
  else if ((char  [8])local_2c8 != (char  [8])0x0) {
    (**(code **)(*(long *)local_2c8 + 8))();
  }
  return uVar7;
}

Assistant:

unsigned DWARFVerifier::verifyNameIndexEntries(
    const DWARFDebugNames::NameIndex &NI,
    const DWARFDebugNames::NameTableEntry &NTE) {
  // Verifying type unit indexes not supported.
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0)
    return 0;

  const char *CStr = NTE.getString();
  if (!CStr) {
    error() << formatv(
        "Name Index @ {0:x}: Unable to get string associated with name {1}.\n",
        NI.getUnitOffset(), NTE.getIndex());
    return 1;
  }
  StringRef Str(CStr);

  unsigned NumErrors = 0;
  unsigned NumEntries = 0;
  uint64_t EntryID = NTE.getEntryOffset();
  uint64_t NextEntryID = EntryID;
  Expected<DWARFDebugNames::Entry> EntryOr = NI.getEntry(&NextEntryID);
  for (; EntryOr; ++NumEntries, EntryID = NextEntryID,
                                EntryOr = NI.getEntry(&NextEntryID)) {
    uint32_t CUIndex = *EntryOr->getCUIndex();
    if (CUIndex > NI.getCUCount()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} contains an "
                         "invalid CU index ({2}).\n",
                         NI.getUnitOffset(), EntryID, CUIndex);
      ++NumErrors;
      continue;
    }
    uint64_t CUOffset = NI.getCUOffset(CUIndex);
    uint64_t DIEOffset = CUOffset + *EntryOr->getDIEUnitOffset();
    DWARFDie DIE = DCtx.getDIEForOffset(DIEOffset);
    if (!DIE) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x} references a "
                         "non-existing DIE @ {2:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset);
      ++NumErrors;
      continue;
    }
    if (DIE.getDwarfUnit()->getOffset() != CUOffset) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched CU of "
                         "DIE @ {2:x}: index - {3:x}; debug_info - {4:x}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, CUOffset,
                         DIE.getDwarfUnit()->getOffset());
      ++NumErrors;
    }
    if (DIE.getTag() != EntryOr->tag()) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Tag of "
                         "DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, EntryOr->tag(),
                         DIE.getTag());
      ++NumErrors;
    }

    auto EntryNames = getNames(DIE);
    if (!is_contained(EntryNames, Str)) {
      error() << formatv("Name Index @ {0:x}: Entry @ {1:x}: mismatched Name "
                         "of DIE @ {2:x}: index - {3}; debug_info - {4}.\n",
                         NI.getUnitOffset(), EntryID, DIEOffset, Str,
                         make_range(EntryNames.begin(), EntryNames.end()));
      ++NumErrors;
    }
  }
  handleAllErrors(EntryOr.takeError(),
                  [&](const DWARFDebugNames::SentinelError &) {
                    if (NumEntries > 0)
                      return;
                    error() << formatv("Name Index @ {0:x}: Name {1} ({2}) is "
                                       "not associated with any entries.\n",
                                       NI.getUnitOffset(), NTE.getIndex(), Str);
                    ++NumErrors;
                  },
                  [&](const ErrorInfoBase &Info) {
                    error()
                        << formatv("Name Index @ {0:x}: Name {1} ({2}): {3}\n",
                                   NI.getUnitOffset(), NTE.getIndex(), Str,
                                   Info.message());
                    ++NumErrors;
                  });
  return NumErrors;
}